

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void memJoin(void *dest,void *src1,size_t count1,void *src2,size_t count2)

{
  bool_t bVar1;
  void *in_RCX;
  size_t in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  void *in_R8;
  size_t i;
  octet o;
  void *in_stack_ffffffffffffffc8;
  void *pvVar2;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar3;
  void *local_28;
  size_t local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar1 = memIsDisjoint2(local_8,local_18,in_RCX,(size_t)local_28);
    if (bVar1 != 0) {
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x11596f);
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x115988);
      return;
    }
    bVar1 = memIsDisjoint2(local_8 + local_18,(size_t)local_28,local_10,local_18);
    if (bVar1 != 0) {
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x1159c9);
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x1159dd);
      return;
    }
    bVar1 = memIsDisjoint2(local_8,(size_t)local_28,local_10,local_18);
    if (bVar1 != 0) {
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x115a18);
      memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,0x115a31);
      for (pvVar2 = (void *)0x0; pvVar2 < local_28; pvVar2 = (void *)((long)pvVar2 + 1)) {
        uVar3 = *local_8;
        memMove((void *)CONCAT17(uVar3,in_stack_ffffffffffffffd0),pvVar2,0x115a70);
        local_8[(long)local_28 + (local_18 - 1)] = uVar3;
      }
      return;
    }
    bVar1 = memIsDisjoint2(local_8 + (long)local_28,local_18,in_RCX,(size_t)local_28);
    if (bVar1 != 0) break;
    *local_8 = *local_10;
    local_8[(long)local_28 + (local_18 - 1)] = *(undefined1 *)((long)in_RCX + (long)local_28 + -1);
    local_18 = local_18 - 1;
    local_28 = (void *)((long)local_28 + -1);
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  }
  memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,0x115add);
  memMove((void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,0x115af1);
  for (pvVar2 = (void *)0x0; pvVar2 < local_28; pvVar2 = (void *)((long)pvVar2 + 1)) {
    uVar3 = *local_8;
    memMove((void *)CONCAT17(uVar3,in_stack_ffffffffffffffd0),pvVar2,0x115b30);
    local_8[(long)local_28 + (local_18 - 1)] = uVar3;
  }
  return;
}

Assistant:

void memJoin(void* dest, const void* src1, size_t count1, const void* src2,
	size_t count2)
{
	register octet o;
	size_t i;
	ASSERT(memIsValid(src1, count1));
	ASSERT(memIsValid(src2, count2));
	ASSERT(memIsValid(dest, count1 + count2));
repeat:
	if (memIsDisjoint2(dest, count1, src2, count2))
	{
		memMove(dest, src1, count1);
		memMove((octet*)dest + count1, src2, count2);
	}
	else if (memIsDisjoint2((octet*)dest + count1, count2, src1, count1))
	{
		memMove((octet*)dest + count1, src2, count2);
		memMove(dest, src1, count1);
	}
	else if (memIsDisjoint2(dest, count2, src1, count1))
	{
		// dest <- src2 || src1
		memMove(dest, src2, count2);
		memMove((octet*)dest + count2, src1, count1);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else if (memIsDisjoint2((octet*)dest + count2, count1, src2, count2))
	{
		// dest <- src2 || src1
		memMove((octet*)dest + count2, src1, count1);
		memMove(dest, src2, count2);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else
	{
		// src1 (src2) пересекается и с префиксом, и с суффиксом dest
		// длины count2 (count1) => и первый, и последний октет dest
		// не входят не входят ни в src1, ни в src2
		((octet*)dest)[0] = ((const octet*)src1)[0];
		((octet*)dest)[count1 + count2 - 1] = ((const octet*)src2)[count2 - 1];
		VERIFY(count1--);
		VERIFY(count2--);
		src1 = (const octet*)src1 + 1;
		dest = (octet*)dest + 1;
		goto repeat;
	}
}